

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  XmlWriter *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  size_type sVar3;
  int iVar4;
  undefined4 extraout_var;
  XmlWriter *pXVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type extraout_RDX;
  StringRef url;
  StringRef name;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef name_03;
  StringRef attribute;
  string stylesheetRef;
  int local_68;
  uint local_64;
  string local_60;
  long *local_40;
  size_type local_38;
  long local_30 [2];
  
  uVar1 = *(undefined4 *)((long)&(testInfo->name).m_start + 4);
  sVar3 = (testInfo->name).m_size;
  uVar2 = *(undefined4 *)((long)&(testInfo->name).m_size + 4);
  *(undefined4 *)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_start =
       *(undefined4 *)&(testInfo->name).m_start;
  *(undefined4 *)((long)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_start + 4) =
       uVar1;
  *(int *)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_size = (int)sVar3;
  *(undefined4 *)((long)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_size + 4) =
       uVar2;
  (*(this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener._vptr_IEventListener
    [0x18])(&local_40,this);
  if (local_38 != 0) {
    url.m_size = local_38;
    url.m_start = (char *)local_40;
    XmlWriter::writeStylesheetRef(&this->m_xml,url);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Catch2TestRun","");
  this_00 = &this->m_xml;
  XmlWriter::startElement(this_00,&local_60,Newline|Indent);
  iVar4 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[3])();
  attribute.m_start._4_4_ = extraout_var;
  attribute.m_start._0_4_ = iVar4;
  name.m_size = 4;
  name.m_start = "name";
  attribute.m_size = extraout_RDX;
  XmlWriter::writeAttribute(this_00,name,attribute);
  local_64 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config
               )->_vptr_IConfig[0x11])();
  name_00.m_size = 8;
  name_00.m_start = "rng-seed";
  pXVar5 = XmlWriter::writeAttribute<unsigned_int,void>(this_00,name_00,&local_64);
  local_68 = 3;
  name_01.m_size = 0x12;
  name_01.m_start = "xml-format-version";
  pXVar5 = XmlWriter::writeAttribute<int,void>(pXVar5,name_01,&local_68);
  libraryVersion();
  name_02.m_size = 0xe;
  name_02.m_start = "catch2-version";
  XmlWriter::writeAttribute<Catch::Version,void>(pXVar5,name_02,&libraryVersion::version);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xd])();
  if (*(long *)CONCAT44(extraout_var_00,iVar4) != ((long *)CONCAT44(extraout_var_00,iVar4))[1]) {
    iVar4 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xd])();
    name_03.m_size = 7;
    name_03.m_start = "filters";
    XmlWriter::writeAttribute<Catch::TestSpec,void>
              (this_00,name_03,(TestSpec *)CONCAT44(extraout_var_01,iVar4));
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void XmlReporter::testRunStarting( TestRunInfo const& testInfo ) {
        StreamingReporterBase::testRunStarting( testInfo );
        std::string stylesheetRef = getStylesheetRef();
        if( !stylesheetRef.empty() )
            m_xml.writeStylesheetRef( stylesheetRef );
        m_xml.startElement("Catch2TestRun")
             .writeAttribute("name"_sr, m_config->name())
             .writeAttribute("rng-seed"_sr, m_config->rngSeed())
             .writeAttribute("xml-format-version"_sr, 3)
             .writeAttribute("catch2-version"_sr, libraryVersion());
        if ( m_config->testSpec().hasFilters() ) {
            m_xml.writeAttribute( "filters"_sr, m_config->testSpec() );
        }
    }